

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

void __thiscall CVmObjBigNum::alloc_bignum(CVmObjBigNum *this,size_t digits)

{
  int iVar1;
  undefined4 extraout_var;
  uint16_t tmp;
  
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,(digits + 1 >> 1) + 5,this);
  (this->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar1);
  *(short *)CONCAT44(extraout_var,iVar1) = (short)digits;
  set_int_val((this->super_CVmObject).ext_,0);
  (this->super_CVmObject).ext_[4] = '\0';
  return;
}

Assistant:

void CVmObjBigNum::alloc_bignum(VMG_ size_t digits)
{
    /* allocate space for the given number of elements */
    ext_ = (char *)G_mem->get_var_heap()
           ->alloc_mem(calc_alloc(digits), this);

    /* set the precision */
    set_prec(ext_, digits);

    /* initialize the value to zero */
    set_int_val(ext_, 0);

    /* clear the flags */
    ext_[VMBN_FLAGS] = 0;
}